

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

bool __thiscall
QMainWindowLayoutState::restoreState
          (QMainWindowLayoutState *this,QDataStream *_stream,QMainWindowLayoutState *oldState)

{
  QRect rect;
  byte bVar1;
  bool bVar2;
  int iVar3;
  const_reference ppQVar4;
  qsizetype qVar5;
  QDockAreaLayout *this_00;
  undefined8 in_RDX;
  QDockAreaLayout *in_RSI;
  QDockAreaLayoutInfo *in_RDI;
  long in_FS_OFFSET;
  QToolBar *w_1;
  int i_1;
  QDockAreaLayoutInfo *info_1;
  QDockWidgetGroupWindow *floatingTab;
  QDockAreaLayoutInfo *info;
  QDockWidget *w;
  int i;
  int length;
  QList<int> oldPath_1;
  QList<int> path_1;
  QList<QToolBar_*> toolBars;
  QRect geometry;
  QList<QDockWidget_*> dockWidgets_1;
  QList<int> oldPath;
  QList<int> path;
  QList<QDockWidget_*> dockWidgets;
  uchar marker;
  QByteArray ba;
  QByteArray copy;
  QDataStream stream;
  QDataStream ds;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  QDockAreaLayoutInfo *in_stack_fffffffffffffd80;
  QDockAreaLayoutInfo *in_stack_fffffffffffffd88;
  QDockAreaLayout *in_stack_fffffffffffffd90;
  QDockAreaLayout *in_stack_fffffffffffffd98;
  QMainWindowLayout *in_stack_fffffffffffffda0;
  QDockAreaLayout *in_stack_fffffffffffffdb0;
  QWidget *in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdd0;
  QToolBarAreaLayout *in_stack_fffffffffffffdd8;
  QDockAreaLayout *in_stack_fffffffffffffde0;
  QDockAreaLayoutInfo *in_stack_fffffffffffffde8;
  QDataStream *in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined7 uVar6;
  undefined1 testing;
  QDockAreaLayoutInfo *stream_00;
  undefined7 in_stack_fffffffffffffe20;
  byte in_stack_fffffffffffffe27;
  QList<QToolBar_*> local_1a8;
  QSize local_190;
  QPoint local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  undefined1 local_170 [16];
  undefined1 *local_160;
  undefined1 *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  QList<QDockWidget_*> local_108;
  byte local_e9;
  QByteArray local_e8;
  QByteArray local_d0 [5];
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = (undefined7)in_RDX;
  testing = (undefined1)((ulong)in_RDX >> 0x38);
  local_d0[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_d0[0].d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_d0[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  stream_00 = in_RDI;
  QByteArray::QByteArray((QByteArray *)0x5f528b);
  while (bVar1 = QDataStream::atEnd(), ((bVar1 ^ 0xff) & 1) != 0) {
    local_e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
    local_e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    in_stack_fffffffffffffdb0 = in_RSI;
    QByteArray::QByteArray(&local_e8,0x400,'\0');
    in_RSI = in_stack_fffffffffffffdb0;
    in_stack_fffffffffffffdb8 = (QWidget *)QByteArray::data((QByteArray *)in_stack_fffffffffffffd80)
    ;
    QByteArray::size(&local_e8);
    in_stack_fffffffffffffe04 =
         QDataStream::readRawData
                   ((char *)in_stack_fffffffffffffdb0,(longlong)in_stack_fffffffffffffdb8);
    QByteArray::resize((longlong)&local_e8);
    QByteArray::operator+=
              ((QByteArray *)in_stack_fffffffffffffd80,
               (QByteArray *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
    QByteArray::~QByteArray((QByteArray *)0x5f536e);
  }
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QDataStream::QDataStream((QDataStream *)&local_28,local_d0);
  iVar3 = QDataStream::version((QDataStream *)in_RSI);
  QDataStream::setVersion((QDataStream *)&local_28,iVar3);
  bVar2 = checkFormat((QMainWindowLayoutState *)in_stack_fffffffffffffda0,
                      (QDataStream *)in_stack_fffffffffffffd98);
  if (bVar2) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_38 = &DAT_aaaaaaaaaaaaaaaa;
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    QDataStream::QDataStream((QDataStream *)&local_48,local_d0);
    iVar3 = QDataStream::version((QDataStream *)in_RSI);
    QDataStream::setVersion((QDataStream *)&local_48,iVar3);
    while (bVar1 = QDataStream::atEnd(), ((bVar1 ^ 0xff) & 1) != 0) {
      local_e9 = 0xaa;
      QDataStream::operator>>
                ((QDataStream *)in_stack_fffffffffffffd80,
                 (quint8 *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
      this_00 = (QDockAreaLayout *)(ulong)(local_e9 - 0xf9);
      switch(this_00) {
      case (QDockAreaLayout *)0x0:
        local_150 = &DAT_aaaaaaaaaaaaaaaa;
        local_148 = &DAT_aaaaaaaaaaaaaaaa;
        local_140 = &DAT_aaaaaaaaaaaaaaaa;
        allMyDockWidgets((QWidget *)in_RDI);
        qt_mainwindow_layout((QMainWindow *)0x5f57ae);
        in_stack_fffffffffffffde0 =
             (QDockAreaLayout *)QMainWindowLayout::createTabbedDockWindow(in_stack_fffffffffffffda0)
        ;
        QDockAreaLayoutInfo::QDockAreaLayoutInfo
                  ((QDockAreaLayoutInfo *)in_stack_fffffffffffffda0,(int *)in_stack_fffffffffffffd98
                   ,(DockPosition)((ulong)in_stack_fffffffffffffd90 >> 0x20),
                   (Orientation)in_stack_fffffffffffffd90,
                   (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                   (QMainWindow *)in_stack_fffffffffffffd80);
        QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)0x5f57fa);
        QDockAreaLayoutInfo::operator=
                  (in_stack_fffffffffffffd80,
                   (QDockAreaLayoutInfo *)
                   CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
        QDockAreaLayoutInfo::~QDockAreaLayoutInfo(in_stack_fffffffffffffd80);
        local_160 = &DAT_aaaaaaaaaaaaaaaa;
        local_158 = &DAT_aaaaaaaaaaaaaaaa;
        QRect::QRect((QRect *)in_stack_fffffffffffffd80);
        ::operator>>((QDataStream *)&local_48,(QRect *)&local_160);
        in_stack_fffffffffffffdd8 =
             (QToolBarAreaLayout *)
             QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)0x5f5861);
        bVar2 = QDockAreaLayoutInfo::restoreState
                          ((QDockAreaLayoutInfo *)
                           CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20),
                           (QDataStream *)stream_00,(QList<QDockWidget_*> *)in_RSI,(bool)testing);
        if (bVar2) {
          local_180 = local_160;
          local_178 = local_158;
          rect.y1.m_i = in_stack_fffffffffffffe04;
          rect.x1.m_i = in_stack_fffffffffffffe00;
          rect._8_7_ = uVar6;
          rect.y2.m_i._3_1_ = testing;
          in_stack_fffffffffffffd90 = in_stack_fffffffffffffde0;
          local_170 = (undefined1  [16])
                      QDockAreaLayout::constrainedRect(rect,(QWidget *)in_stack_fffffffffffffd98);
          local_160 = (undefined1 *)local_170._0_8_;
          local_158 = (undefined1 *)local_170._8_8_;
          in_stack_fffffffffffffd98 = in_stack_fffffffffffffd90;
          local_188 = QRect::topLeft((QRect *)CONCAT17(in_stack_fffffffffffffd7f,
                                                       in_stack_fffffffffffffd78));
          QWidget::move((QWidget *)in_stack_fffffffffffffdb0,(QPoint *)this_00);
          in_stack_fffffffffffffde0 = in_stack_fffffffffffffd98;
          local_190 = QRect::size((QRect *)in_stack_fffffffffffffd90);
          QWidget::resize(in_stack_fffffffffffffdb8,(QSize *)in_stack_fffffffffffffdb0);
          bVar2 = QDockAreaLayoutInfo::onlyHasPlaceholders(in_stack_fffffffffffffd88);
          if (bVar2) {
            QDockAreaLayoutInfo::reparentWidgets(in_RDI,in_stack_fffffffffffffdb8);
          }
          else {
            QWidget::show((QWidget *)in_stack_fffffffffffffd90);
          }
          iVar3 = 0;
        }
        else {
          in_stack_fffffffffffffe27 = 0;
          iVar3 = 1;
        }
        QList<QDockWidget_*>::~QList((QList<QDockWidget_*> *)0x5f59ad);
        if (iVar3 == 0) goto LAB_005f5c3a;
        goto LAB_005f5c52;
      default:
        in_stack_fffffffffffffe27 = 0;
        goto LAB_005f5c52;
      case (QDockAreaLayout *)0x3:
      case (QDockAreaLayout *)0x5:
        local_1a8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_1a8.d.ptr = (QToolBar **)&DAT_aaaaaaaaaaaaaaaa;
        local_1a8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        findChildrenHelper<QToolBar*>((QObject *)this_00);
        bVar2 = QToolBarAreaLayout::restoreState
                          ((QToolBarAreaLayout *)
                           CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8),
                           in_stack_fffffffffffffdf0,(QList<QToolBar_*> *)in_stack_fffffffffffffde8,
                           (uchar)((ulong)in_stack_fffffffffffffde0 >> 0x38),
                           SUB81((ulong)in_stack_fffffffffffffde0 >> 0x30,0));
        if (bVar2) {
          iVar3 = 0;
          while( true ) {
            in_stack_fffffffffffffd88 = (QDockAreaLayoutInfo *)(long)iVar3;
            qVar5 = QList<QToolBar_*>::size(&local_1a8);
            if (qVar5 <= (long)in_stack_fffffffffffffd88) break;
            QList<QToolBar_*>::at
                      ((QList<QToolBar_*> *)in_stack_fffffffffffffd80,
                       CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
            QToolBarAreaLayout::indexOf
                      (in_stack_fffffffffffffdd8,
                       (QWidget *)CONCAT44(iVar3,in_stack_fffffffffffffdd0));
            bVar2 = QList<int>::isEmpty((QList<int> *)0x5f5aea);
            if (bVar2) {
              QToolBarAreaLayout::indexOf
                        (in_stack_fffffffffffffdd8,
                         (QWidget *)CONCAT44(iVar3,in_stack_fffffffffffffdd0));
              bVar2 = QList<int>::isEmpty((QList<int> *)0x5f5b4b);
              if (!bVar2) {
                in_stack_fffffffffffffd80 = (QDockAreaLayoutInfo *)&(in_RDI->rect).x2;
                QList<int>::at((QList<int> *)in_stack_fffffffffffffd80,
                               CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
                QToolBarAreaLayoutInfo::insertToolBar
                          ((QToolBarAreaLayoutInfo *)in_stack_fffffffffffffda0,
                           (QToolBar *)in_stack_fffffffffffffd98,
                           (QToolBar *)in_stack_fffffffffffffd90);
              }
              QList<int>::~QList((QList<int> *)0x5f5bb6);
            }
            QList<int>::~QList((QList<int> *)0x5f5bdd);
            iVar3 = iVar3 + 1;
          }
          iVar3 = 0;
        }
        else {
          in_stack_fffffffffffffe27 = 0;
          iVar3 = 1;
        }
        QList<QToolBar_*>::~QList((QList<QToolBar_*> *)0x5f5c16);
        break;
      case (QDockAreaLayout *)0x4:
        local_108.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_108.d.ptr = (QDockWidget **)&DAT_aaaaaaaaaaaaaaaa;
        local_108.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        allMyDockWidgets((QWidget *)in_RDI);
        bVar2 = QDockAreaLayout::restoreState
                          (in_stack_fffffffffffffdb0,(QDataStream *)this_00,
                           (QList<QDockWidget_*> *)in_stack_fffffffffffffda0,
                           SUB81((ulong)in_stack_fffffffffffffd98 >> 0x38,0));
        if (bVar2) {
          in_stack_fffffffffffffdfc = 0;
          while( true ) {
            in_stack_fffffffffffffda0 = (QMainWindowLayout *)(long)in_stack_fffffffffffffdfc;
            qVar5 = QList<QDockWidget_*>::size(&local_108);
            if (qVar5 <= (long)in_stack_fffffffffffffda0) break;
            ppQVar4 = QList<QDockWidget_*>::at
                                ((QList<QDockWidget_*> *)in_stack_fffffffffffffd80,
                                 CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
            in_stack_fffffffffffffdf0 = (QDataStream *)*ppQVar4;
            local_120 = &DAT_aaaaaaaaaaaaaaaa;
            local_118 = &DAT_aaaaaaaaaaaaaaaa;
            local_110 = &DAT_aaaaaaaaaaaaaaaa;
            QDockAreaLayout::indexOf(this_00,(QWidget *)in_stack_fffffffffffffda0);
            bVar2 = QList<int>::isEmpty((QList<int> *)0x5f5610);
            if (bVar2) {
              local_138 = &DAT_aaaaaaaaaaaaaaaa;
              local_130 = &DAT_aaaaaaaaaaaaaaaa;
              local_128 = &DAT_aaaaaaaaaaaaaaaa;
              QDockAreaLayout::indexOf(this_00,(QWidget *)in_stack_fffffffffffffda0);
              bVar2 = QList<int>::isEmpty((QList<int> *)0x5f5674);
              if ((!bVar2) &&
                 (in_stack_fffffffffffffde8 =
                       QDockAreaLayout::info
                                 (in_stack_fffffffffffffd98,(QList<int> *)in_stack_fffffffffffffd90)
                 , in_stack_fffffffffffffde8 != (QDockAreaLayoutInfo *)0x0)) {
                QDockAreaLayoutInfo::add(in_RDI,in_stack_fffffffffffffdb8);
              }
              QList<int>::~QList((QList<int> *)0x5f56e1);
            }
            QList<int>::~QList((QList<int> *)0x5f5708);
            in_stack_fffffffffffffdfc = in_stack_fffffffffffffdfc + 1;
          }
          iVar3 = 0;
        }
        else {
          in_stack_fffffffffffffe27 = 0;
          iVar3 = 1;
        }
        QList<QDockWidget_*>::~QList((QList<QDockWidget_*> *)0x5f5747);
      }
      if (iVar3 != 0) goto LAB_005f5c52;
LAB_005f5c3a:
      in_stack_fffffffffffffe00 = 0;
    }
    in_stack_fffffffffffffe27 = 1;
LAB_005f5c52:
    QDataStream::~QDataStream((QDataStream *)&local_48);
  }
  else {
    in_stack_fffffffffffffe27 = 0;
  }
  QDataStream::~QDataStream((QDataStream *)&local_28);
  QByteArray::~QByteArray((QByteArray *)0x5f5c79);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(in_stack_fffffffffffffe27 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QMainWindowLayoutState::restoreState(QDataStream &_stream,
                                        const QMainWindowLayoutState &oldState)
{
    //make a copy of the data so that we can read it more than once
    QByteArray copy;
    while(!_stream.atEnd()) {
        int length = 1024;
        QByteArray ba(length, '\0');
        length = _stream.readRawData(ba.data(), ba.size());
        ba.resize(length);
        copy += ba;
    }

    QDataStream ds(copy);
    ds.setVersion(_stream.version());
    if (!checkFormat(ds))
        return false;

    QDataStream stream(copy);
    stream.setVersion(_stream.version());

    while (!stream.atEnd()) {
        uchar marker;
        stream >> marker;
        switch(marker)
        {
#if QT_CONFIG(dockwidget)
            case QDockAreaLayout::DockWidgetStateMarker:
                {
                    const auto dockWidgets = allMyDockWidgets(mainWindow);
                    if (!dockAreaLayout.restoreState(stream, dockWidgets))
                        return false;

                    for (int i = 0; i < dockWidgets.size(); ++i) {
                        QDockWidget *w = dockWidgets.at(i);
                        QList<int> path = dockAreaLayout.indexOf(w);
                        if (path.isEmpty()) {
                            QList<int> oldPath = oldState.dockAreaLayout.indexOf(w);
                            if (oldPath.isEmpty()) {
                                continue;
                            }
                            QDockAreaLayoutInfo *info = dockAreaLayout.info(oldPath);
                            if (info == nullptr) {
                                continue;
                            }
                            info->add(w);
                        }
                    }
                }
                break;
#if QT_CONFIG(tabwidget)
            case QDockAreaLayout::FloatingDockWidgetTabMarker:
            {
                auto dockWidgets = allMyDockWidgets(mainWindow);
                QDockWidgetGroupWindow* floatingTab = qt_mainwindow_layout(mainWindow)->createTabbedDockWindow();
                *floatingTab->layoutInfo() = QDockAreaLayoutInfo(
                    &dockAreaLayout.sep, QInternal::LeftDock, // FIXME: DockWidget doesn't save original docking area
                    Qt::Horizontal, QTabBar::RoundedSouth, mainWindow);
                QRect geometry;
                stream >> geometry;
                QDockAreaLayoutInfo *info = floatingTab->layoutInfo();
                if (!info->restoreState(stream, dockWidgets, false))
                    return false;
                geometry = QDockAreaLayout::constrainedRect(geometry, floatingTab);
                floatingTab->move(geometry.topLeft());
                floatingTab->resize(geometry.size());

                // Don't show an empty QDockWidgetGroupWindow if no dock widget is available yet.
                // reparentWidgets() would be triggered by show(), so do it explicitly here.
                if (info->onlyHasPlaceholders())
                    info->reparentWidgets(floatingTab);
                else
                    floatingTab->show();
            }
            break;
#endif // QT_CONFIG(tabwidget)
#endif // QT_CONFIG(dockwidget)

#if QT_CONFIG(toolbar)
            case QToolBarAreaLayout::ToolBarStateMarker:
            case QToolBarAreaLayout::ToolBarStateMarkerEx:
                {
                    QList<QToolBar *> toolBars = findChildrenHelper<QToolBar*>(mainWindow);
                    if (!toolBarAreaLayout.restoreState(stream, toolBars, marker))
                        return false;

                    for (int i = 0; i < toolBars.size(); ++i) {
                        QToolBar *w = toolBars.at(i);
                        QList<int> path = toolBarAreaLayout.indexOf(w);
                        if (path.isEmpty()) {
                            QList<int> oldPath = oldState.toolBarAreaLayout.indexOf(w);
                            if (oldPath.isEmpty()) {
                                continue;
                            }
                            toolBarAreaLayout.docks[oldPath.at(0)].insertToolBar(nullptr, w);
                        }
                    }
                }
                break;
#endif // QT_CONFIG(toolbar)
            default:
                return false;
        }// switch
    } //while


    return true;
}